

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O2

PClassInventory * dyn_cast<PClassInventory>(DObject *p)

{
  bool bVar1;
  
  if ((p != (DObject *)0x0) &&
     (bVar1 = DObject::IsKindOf(p,PClassInventory::RegistrationInfo.MyClass), bVar1)) {
    return (PClassInventory *)p;
  }
  return (PClassInventory *)0x0;
}

Assistant:

T *dyn_cast(DObject *p)
{
	if (p != NULL && p->IsKindOf(RUNTIME_CLASS_CASTLESS(T)))
	{
		return static_cast<T *>(p);
	}
	return NULL;
}